

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O3

void __thiscall
tcu::TestLog::writeImage
          (TestLog *this,char *name,char *description,ConstPixelBufferAccess *access,
          Vec4 *pixelScale,Vec4 *pixelBias,qpImageCompressionMode compressionMode)

{
  ulong uVar1;
  int i;
  deUint32 dVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  undefined1 auStack_378 [8];
  float local_370;
  float local_36c;
  Sampler *local_368;
  ulong local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  ulong local_340;
  Vec4 *local_338;
  Vec4 *local_330;
  ulong local_328;
  int local_31c;
  int local_318;
  int local_314;
  IVec3 scaledSize;
  Vec4 p;
  long local_2d8 [2];
  PixelBufferAccess logImageAccess;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined8 local_26c;
  undefined1 uStack_264;
  undefined7 uStack_263;
  undefined1 uStack_25c;
  undefined8 uStack_25b;
  undefined4 local_250;
  PixelBufferAccess blendImageAccess;
  Vec4 s;
  vector<float,_std::allocator<float>_> blendImage;
  TextureLevel logImage;
  Vec4 b;
  ostringstream longDesc;
  
  local_358 = *(_func_int ***)(access->m_size).m_data;
  uStack_350 = 0;
  iVar12 = (access->m_size).m_data[2];
  local_368 = (Sampler *)access;
  local_338 = pixelScale;
  local_330 = pixelBias;
  dVar2 = qpTestLog_getLogFlags(this->m_log);
  if ((dVar2 & 1) == 0) {
    if (iVar12 == 1) {
      auVar17._0_4_ = -(uint)(0x1000 < (int)(float)local_358);
      auVar17._4_4_ = -(uint)(0x1000 < (int)(float)local_358);
      auVar17._8_4_ = -(uint)(0x1000 < (int)local_358._4_4_);
      auVar17._12_4_ = -(uint)(0x1000 < (int)local_358._4_4_);
      uVar9 = movmskpd(1,auVar17);
      uVar9 = uVar9 ^ 3;
      if ((((uVar9 & 2) != 0) && ((uVar9 & 1) != 0)) &&
         ((local_368->wrapT == REPEAT_CL && (((TextureFormat *)&local_368->wrapS)->order - RGB < 2))
         )) {
        iVar12 = ((IVec3 *)&local_368->lodThreshold)->m_data[0];
        iVar3 = TextureFormat::getPixelSize((TextureFormat *)local_368);
        if (iVar12 == iVar3) {
          auVar22._4_4_ = -(uint)(local_330->m_data[1] != 0.0);
          auVar22._0_4_ = -(uint)(local_330->m_data[0] != 0.0);
          auVar22._8_4_ = -(uint)(local_330->m_data[2] != 0.0);
          auVar22._12_4_ = -(uint)(local_330->m_data[3] != 0.0);
          auVar19._4_4_ = -(uint)(local_338->m_data[1] != 1.0);
          auVar19._0_4_ = -(uint)(local_338->m_data[0] != 1.0);
          auVar19._8_4_ = -(uint)(local_338->m_data[2] != 1.0);
          auVar19._12_4_ = -(uint)(local_338->m_data[3] != 1.0);
          auVar23 = packssdw(auVar22,auVar19);
          auVar23 = packsswb(auVar23,auVar23);
          if ((((((((auVar23 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar23 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar23 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar23 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar23 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar23 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            writeImage(this,name,description,compressionMode,
                       (uint)(((TextureFormat *)&local_368->wrapS)->order == RGBA),
                       (int)(float)local_358,local_358._4_4_,*(int *)&local_368->normalizedCoords,
                       *(void **)&local_368->compareChannel);
            return;
          }
        }
      }
      local_288 = 0;
      uStack_280 = 0x100000000;
      local_278 = 0;
      local_270 = 1;
      local_250 = 0;
      local_26c = 0;
      uStack_264 = 0;
      uStack_263 = 0;
      uStack_25c = 0;
      uStack_25b = 0;
      uVar16 = (uint)(float)local_358;
      uVar18 = local_358._4_4_;
      if ((byte)((byte)uVar9 & (byte)uVar9 >> 1) == 0) {
        auVar23._0_4_ = 1.0;
        uVar9 = (uint)(float)local_358;
        bVar7 = true;
        do {
          bVar8 = bVar7;
          uVar16 = -(uint)((float)(int)uVar9 * 0.00024414062 <= auVar23._0_4_);
          auVar23._0_4_ =
               (float)((uint)auVar23._0_4_ & uVar16 |
                      ~uVar16 & (uint)((float)(int)uVar9 * 0.00024414062));
          uVar9 = local_358._4_4_;
          bVar7 = false;
        } while (bVar8);
        auVar20._0_4_ = (float)(int)(float)local_358;
        auVar20._4_4_ = (float)(int)local_358._4_4_;
        auVar20._8_4_ = (float)(int)uStack_350;
        auVar20._12_4_ = (float)uStack_350._4_4_;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar23 = divps(auVar20,auVar23);
        uVar9 = -(uint)(auVar23._0_4_ < 0.0);
        uVar16 = -(uint)(auVar23._4_4_ < 0.0);
        uVar1 = CONCAT44(uVar16,uVar9) & 0xbf000000bf000000 |
                CONCAT44(~uVar16,~uVar9) & 0x3f0000003f000000;
        uVar9 = (uint)((float)uVar1 + auVar23._0_4_);
        uVar18 = (uint)((float)(uVar1 >> 0x20) + auVar23._4_4_);
        uVar16 = -(uint)(1 < (int)uVar9);
        uVar24 = -(uint)(1 < (int)uVar18);
        uVar16 = ~uVar16 & 1 | uVar9 & uVar16;
        uVar18 = ~uVar24 & 1 | uVar18 & uVar24;
      }
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x300000008;
      TextureLevel::TextureLevel
                ((TextureLevel *)&blendImageAccess,(TextureFormat *)&longDesc,uVar16,uVar18,1);
      TextureLevel::getAccess((PixelBufferAccess *)&logImage,(TextureLevel *)&blendImageAccess);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&longDesc);
      if (description == (char *)0x0) {
        std::ios::clear((int)auStack_378 +
                        (int)longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3] + 0x1d0);
      }
      else {
        sVar5 = strlen(description);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,description,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>," (p\' = p * ",0xb);
      poVar6 = tcu::operator<<(&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,
                               local_338);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," + ",3);
      poVar6 = tcu::operator<<(poVar6,local_330);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      if (0 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1]) {
        iVar11 = 0;
        iVar12 = blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1];
        iVar3 = blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0];
        do {
          if (0 < iVar3) {
            local_358 = (_func_int **)CONCAT44(local_358._4_4_,(float)iVar11 + 0.5);
            iVar14 = 0;
            do {
              ConstPixelBufferAccess::sample2D
                        ((ConstPixelBufferAccess *)&p,local_368,(FilterMode)&local_288,
                         ((float)iVar14 + 0.5) / (float)iVar3,
                         (float)local_358 /
                         (float)blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                         uStack_280._4_4_);
              logImageAccess.super_ConstPixelBufferAccess.m_format.type =
                   (ChannelType)(local_330->m_data[1] + local_338->m_data[1] * p.m_data[1]);
              logImageAccess.super_ConstPixelBufferAccess.m_format.order =
                   (ChannelOrder)(local_330->m_data[0] + local_338->m_data[0] * p.m_data[0]);
              logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1] =
                   (int)(local_330->m_data[3] + local_338->m_data[3] * p.m_data[3]);
              logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0] =
                   (int)(local_330->m_data[2] + local_338->m_data[2] * p.m_data[2]);
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&logImage,(Vec4 *)&logImageAccess,iVar14,iVar11,0);
              iVar14 = iVar14 + 1;
              iVar12 = blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1];
              iVar3 = blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0];
            } while (iVar14 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0]);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar12);
      }
      std::__cxx11::stringbuf::str();
      writeImage(this,name,(char *)logImageAccess.super_ConstPixelBufferAccess.m_format,
                 compressionMode,QP_IMAGE_FORMAT_RGBA8888,logImage.m_size.m_data[0],
                 logImage.m_size.m_data[1],(int)logImage.m_data.m_ptr,(void *)logImage.m_data.m_cap)
      ;
      if (logImageAccess.super_ConstPixelBufferAccess.m_format !=
          (TextureFormat)(logImageAccess.super_ConstPixelBufferAccess.m_size.m_data + 2)) {
        operator_delete((void *)logImageAccess.super_ConstPixelBufferAccess.m_format,
                        logImageAccess.super_ConstPixelBufferAccess._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&longDesc);
      std::ios_base::~ios_base
                ((ios_base *)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                );
      TextureLevel::~TextureLevel((TextureLevel *)&blendImageAccess);
    }
    else {
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = local_358;
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = iVar12;
      bVar7 = true;
      lVar4 = 0;
      do {
        while (bVar7) {
          iVar3 = *(int *)((long)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream + lVar4 * 4);
          bVar7 = iVar3 < 0x81;
          lVar4 = lVar4 + 1;
          if (lVar4 == 3) {
            if (iVar3 < 0x81) {
              scaledSize.m_data._0_8_ = local_358;
              scaledSize.m_data[2] = iVar12;
              goto LAB_0199f34b;
            }
            goto LAB_0199f2b8;
          }
        }
        lVar4 = lVar4 + 1;
        bVar7 = false;
      } while (lVar4 != 3);
LAB_0199f2b8:
      auVar23._0_4_ = 1.0;
      lVar4 = 0;
      do {
        fVar21 = (float)*(int *)((long)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream + lVar4 * 4) * 0.0078125;
        uVar9 = -(uint)(fVar21 <= auVar23._0_4_);
        auVar23._0_4_ = (float)((uint)auVar23._0_4_ & uVar9 | ~uVar9 & (uint)fVar21);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      scaledSize.m_data[2] = 0;
      scaledSize.m_data[0] = 0;
      scaledSize.m_data[1] = 0;
      lVar4 = 0;
      do {
        fVar21 = (float)*(int *)((long)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream + lVar4 * 4) / auVar23._0_4_;
        iVar12 = (int)(fVar21 + *(float *)(&DAT_01b77e94 + (ulong)(fVar21 < 0.0) * 4));
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        scaledSize.m_data[lVar4] = iVar12;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
LAB_0199f34b:
      iVar12 = scaledSize.m_data[0];
      local_360 = (ulong)(uint)scaledSize.m_data[1];
      local_340 = (ulong)(uint)scaledSize.m_data[2];
      iVar11 = scaledSize.m_data[2] + scaledSize.m_data[0] + -1;
      iVar3 = scaledSize.m_data[2] + scaledSize.m_data[0] + scaledSize.m_data[1];
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((ulong)local_358 & 0xffffffff00000000);
      std::vector<float,_std::allocator<float>_>::vector
                (&blendImage,(long)(iVar3 * iVar11 * 4),(value_type_conflict2 *)&longDesc,
                 (allocator_type *)&local_288);
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x2300000008;
      PixelBufferAccess::PixelBufferAccess
                (&blendImageAccess,(TextureFormat *)&longDesc,iVar11,iVar3,1,
                 blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x300000008;
      TextureLevel::TextureLevel(&logImage,(TextureFormat *)&longDesc,iVar11,iVar3,1);
      TextureLevel::getAccess(&logImageAccess,&logImage);
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      local_270 = 1;
      local_250 = 0;
      local_26c = 0;
      uStack_264 = 0;
      uStack_263 = 0;
      uStack_25c = 0;
      uStack_25b = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&longDesc);
      iVar3 = (int)local_340;
      if (-1 < iVar3 + -1) {
        iVar14 = (int)local_360;
        local_328 = CONCAT44(local_328._4_4_,(float)iVar12);
        local_31c = iVar14 + iVar12;
        local_318 = iVar12 + iVar3 + -2;
        iVar11 = iVar3 + -1;
        do {
          if (0 < (int)(float)local_360) {
            local_36c = ((float)iVar11 + 0.5) / (float)iVar3;
            local_370 = 0.0;
            local_314 = local_31c;
            do {
              if (0 < iVar12) {
                local_358 = (_func_int **)
                            CONCAT44(local_358._4_4_,((float)(int)local_370 + 0.5) / (float)iVar14);
                iVar15 = 0;
                iVar10 = local_314;
                iVar13 = local_318;
                do {
                  ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)&p,(int)&blendImageAccess,iVar13,iVar10);
                  ConstPixelBufferAccess::sample3D
                            ((ConstPixelBufferAccess *)&s,local_368,(FilterMode)&local_288,
                             ((float)iVar15 + 0.5) / (float)local_328,(float)local_358,local_36c);
                  b.m_data[0] = p.m_data[0] * 0.85 + s.m_data[0];
                  b.m_data[1] = p.m_data[1] * 0.85 + s.m_data[1];
                  b.m_data[2] = p.m_data[2] * 0.85 + s.m_data[2];
                  b.m_data[3] = p.m_data[3] * 0.85 + s.m_data[3];
                  PixelBufferAccess::setPixel(&blendImageAccess,&b,iVar13,iVar10,0);
                  iVar15 = iVar15 + 1;
                  iVar10 = iVar10 + -1;
                  iVar13 = iVar13 + -1;
                } while (iVar15 != iVar12);
              }
              local_370 = (float)((int)local_370 + 1);
              local_314 = local_314 + -1;
            } while (local_370 != (float)local_360);
          }
          local_31c = local_31c + 1;
          local_318 = local_318 + -1;
          bVar7 = 0 < iVar11;
          iVar11 = iVar11 + -1;
        } while (bVar7);
      }
      if (description == (char *)0x0) {
        std::ios::clear((int)auStack_378 +
                        (int)longDesc.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3] + 0x1d0);
      }
      else {
        sVar5 = strlen(description);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,description,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&longDesc.super_basic_ostream<char,_std::char_traits<char>_>," (p\' = p * ",0xb);
      poVar6 = tcu::operator<<(&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,
                               local_338);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," + ",3);
      poVar6 = tcu::operator<<(poVar6,local_330);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      p.m_data[2] = 2.14399e-43;
      p.m_data[3] = 3.57331e-43;
      p.m_data[0] = 7.14662e-44;
      p.m_data[1] = 1.42932e-43;
      tcu::clear(&logImageAccess,(IVec4 *)&p);
      if (0 < (int)local_340) {
        iVar3 = (int)local_360;
        local_368 = (Sampler *)CONCAT44(local_368._4_4_,iVar3 + -1);
        local_328 = (ulong)(iVar12 - 1);
        local_370 = (float)((int)local_340 + iVar3 + iVar12 + -1);
        local_358 = (_func_int **)((ulong)local_358 & 0xffffffff00000000);
        do {
          if (0 < (int)(float)local_360) {
            iVar11 = 0;
            local_36c = local_370;
            do {
              if (0 < iVar12) {
                iVar14 = 0;
                do {
                  iVar10 = iVar14 + -1;
                  if ((((iVar11 == iVar3 + -2) || (iVar11 == (int)local_368)) ||
                      ((float)local_358 == 0.0)) || (iVar14 == 0)) {
                    iVar13 = (int)local_328 + iVar14;
                    iVar14 = iVar14 + (int)local_36c;
                    ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)&s,(int)&blendImageAccess,iVar13,iVar14);
                    p.m_data[0] = local_330->m_data[0] + local_338->m_data[0] * s.m_data[0];
                    p.m_data[1] = local_330->m_data[1] + local_338->m_data[1] * s.m_data[1];
                    p.m_data[2] = local_330->m_data[2] + local_338->m_data[2] * s.m_data[2];
                    p.m_data[3] = local_330->m_data[3] + local_338->m_data[3] * s.m_data[3];
                    PixelBufferAccess::setPixel(&logImageAccess,&p,iVar13,iVar14,0);
                  }
                  iVar14 = iVar10;
                } while (-iVar12 != iVar10);
              }
              iVar11 = iVar11 + 1;
              local_36c = (float)((int)local_36c + -1);
            } while ((float)iVar11 != (float)local_360);
          }
          iVar11 = (int)(float)local_358 + 1;
          local_328 = (ulong)((int)local_328 + 1);
          local_370 = (float)((int)local_370 + -1);
          local_358 = (_func_int **)CONCAT44(local_358._4_4_,iVar11);
        } while (iVar11 != (int)local_340);
      }
      std::__cxx11::stringbuf::str();
      writeImage(this,name,(char *)p.m_data._0_8_,compressionMode,QP_IMAGE_FORMAT_RGBA8888,
                 logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0],
                 logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                 logImageAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1],
                 logImageAccess.super_ConstPixelBufferAccess.m_data);
      if ((long *)p.m_data._0_8_ != local_2d8) {
        operator_delete((void *)p.m_data._0_8_,local_2d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&longDesc);
      std::ios_base::~ios_base
                ((ios_base *)&longDesc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                );
      TextureLevel::~TextureLevel(&logImage);
      if (blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void TestLog::writeImage (const char* name, const char* description, const ConstPixelBufferAccess& access, const Vec4& pixelScale, const Vec4& pixelBias, qpImageCompressionMode compressionMode)
{
	const TextureFormat&	format		= access.getFormat();
	int						width		= access.getWidth();
	int						height		= access.getHeight();
	int						depth		= access.getDepth();

	// Writing a combined image does not make sense
	DE_ASSERT(!tcu::isCombinedDepthStencilType(access.getFormat().type));

	// Do not bother with preprocessing if images are not stored
	if ((qpTestLog_getLogFlags(m_log) & QP_TEST_LOG_EXCLUDE_IMAGES) != 0)
		return;

	if (depth == 1 && format.type == TextureFormat::UNORM_INT8
		&& width <= MAX_IMAGE_SIZE_2D && height <= MAX_IMAGE_SIZE_2D
		&& (format.order == TextureFormat::RGB || format.order == TextureFormat::RGBA)
		&& access.getPixelPitch() == access.getFormat().getPixelSize()
		&& pixelBias[0] == 0.0f && pixelBias[1] == 0.0f && pixelBias[2] == 0.0f && pixelBias[3] == 0.0f
		&& pixelScale[0] == 1.0f && pixelScale[1] == 1.0f && pixelScale[2] == 1.0f && pixelScale[3] == 1.0f)
	{
		// Fast-path.
		bool isRGBA = format.order == TextureFormat::RGBA;

		writeImage(name, description, compressionMode,
				   isRGBA ? QP_IMAGE_FORMAT_RGBA8888 : QP_IMAGE_FORMAT_RGB888,
				   width, height, access.getRowPitch(), access.getDataPtr());
	}
	else if (depth == 1)
	{
		Sampler				sampler			(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::LINEAR, Sampler::NEAREST);
		IVec2				logImageSize	= computeScaledSize(IVec2(width, height), MAX_IMAGE_SIZE_2D);
		tcu::TextureLevel	logImage		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageSize.x(), logImageSize.y(), 1);
		PixelBufferAccess	logImageAccess	= logImage.getAccess();
		std::ostringstream	longDesc;

		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		for (int y = 0; y < logImage.getHeight(); y++)
		{
			for (int x = 0; x < logImage.getWidth(); x++)
			{
				float	yf	= ((float)y + 0.5f) / (float)logImage.getHeight();
				float	xf	= ((float)x + 0.5f) / (float)logImage.getWidth();
				Vec4	s	= access.sample2D(sampler, sampler.minFilter, xf, yf, 0)*pixelScale + pixelBias;

				logImageAccess.setPixel(s, x, y);
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
	else
	{
		// Isometric splat volume rendering.
		const float			blendFactor			= 0.85f;
		IVec3				scaledSize			= computeScaledSize(IVec3(width, height, depth), MAX_IMAGE_SIZE_3D);
		int					w					= scaledSize.x();
		int					h					= scaledSize.y();
		int					d					= scaledSize.z();
		int					logImageW			= w+d - 1;
		int					logImageH			= w+d+h;
		std::vector<float>	blendImage			(logImageW*logImageH*4, 0.0f);
		PixelBufferAccess	blendImageAccess	(TextureFormat(TextureFormat::RGBA, TextureFormat::FLOAT), logImageW, logImageH, 1, &blendImage[0]);
		tcu::TextureLevel	logImage			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageW, logImageH, 1);
		PixelBufferAccess	logImageAccess		= logImage.getAccess();
		Sampler				sampler				(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
		std::ostringstream	longDesc;

		// \note Back-to-front.
		for (int z = d-1; z >= 0; z--)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);

					float	xf	= ((float)x + 0.5f) / (float)w;
					float	yf	= ((float)y + 0.5f) / (float)h;
					float	zf	= ((float)z + 0.5f) / (float)d;

					Vec4	p	= blendImageAccess.getPixel(px, py);
					Vec4	s	= access.sample3D(sampler, sampler.minFilter, xf, yf, zf);
					Vec4	b	= s + p*blendFactor;

					blendImageAccess.setPixel(b, px, py);
				}
			}
		}

		// Scale blend image nicely.
		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		// Write to final image.
		tcu::clear(logImageAccess, tcu::IVec4(0x33, 0x66, 0x99, 0xff));

		for (int z = 0; z < d; z++)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					if (z != 0 && !(x == 0 || y == h-1 || y == h-2))
						continue;

					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);
					Vec4	s	= blendImageAccess.getPixel(px, py)*pixelScale + pixelBias;

					logImageAccess.setPixel(s, px, py);
				}
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
}